

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadString(CodedInputStream *input,string *value)

{
  bool bVar1;
  undefined8 in_RAX;
  pointer __dest;
  size_t __n;
  uint32 length;
  uint32 local_24;
  
  local_24 = (uint32)((ulong)in_RAX >> 0x20);
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_24);
  if ((!bVar1) || (__n = (size_t)(int)local_24, (long)__n < 0)) {
    return false;
  }
  if (*(int *)&input->buffer_end_ - *(int *)&input->buffer_ < (int)local_24) {
    bVar1 = io::CodedInputStream::ReadStringFallback(input,value,local_24);
    return bVar1;
  }
  std::__cxx11::string::resize((ulong)value);
  if (local_24 == 0) {
    return true;
  }
  if (value->_M_string_length == 0) {
    __dest = (pointer)0x0;
  }
  else {
    __dest = (value->_M_dataplus)._M_p;
  }
  memcpy(__dest,input->buffer_,__n);
  input->buffer_ = input->buffer_ + __n;
  return true;
}

Assistant:

bool WireFormatLite::ReadString(io::CodedInputStream* input,
                                string* value) {
  // String is for UTF-8 text only
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->InternalReadStringInline(value, length)) return false;
  return true;
}